

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareDistance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *y,longdouble r2)

{
  double dVar1;
  int local_2c;
  int sign;
  longdouble r2_local;
  Vector3<long_double> *y_local;
  Vector3<long_double> *x_local;
  
  local_2c = TriageCompareCosDistance<long_double>(x,y,r2);
  if (local_2c == 0) {
    dVar1 = S1ChordAngle::length2((S1ChordAngle *)&k45Degrees);
    if (r2 < (longdouble)dVar1) {
      local_2c = TriageCompareSin2Distance<long_double>(x,y,r2);
    }
  }
  return local_2c;
}

Assistant:

int TriageCompareDistance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  // The Sin2 method is much more accurate for small distances, but it is only
  // valid when the actual distance and the distance limit are both less than
  // 90 degrees.  So we always start with the Cos method.
  int sign = TriageCompareCosDistance(x, y, r2);
  if (sign == 0 && r2 < k45Degrees.length2()) {
    sign = TriageCompareSin2Distance(x, y, r2);
  }
  return sign;
}